

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitBlockExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,BlockExpr *expr)

{
  bool bVar1;
  ostream *poVar2;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  *this_00;
  type stmt;
  type expr_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *local_1d8;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *statement;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  *__range1;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  BlockExpr *local_20;
  BlockExpr *expr_local;
  AstSerialise *this_local;
  
  local_20 = expr;
  expr_local = (BlockExpr *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
  std::operator<<(poVar2,"(Expr::Block (\n");
  std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
  this_00 = &local_20->stmts;
  __end1 = std::
           vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ::begin(this_00);
  statement = (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)
              std::
              vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
              ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_*,_std::vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>_>
                                *)&statement);
    if (!bVar1) break;
    local_1d8 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_*,_std::vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>_>
                ::operator*(&__end1);
    poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
    stmt = std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>::operator*(local_1d8);
    StmtVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    visitStmt(&local_1f8,
              (StmtVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,stmt);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_1f8);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_*,_std::vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>_>
    ::operator++(&__end1);
  }
  poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
  expr_00 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                      (&local_20->expr);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_218,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,expr_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_218);
  std::operator<<(poVar2,')');
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitBlockExpr(BlockExpr &expr) {
        std::stringstream s;

        s << m_ident << "(Expr::Block (\n";
        m_ident += "    ";

        for (auto &statement : expr.stmts) {
            s << m_ident << visitStmt(*statement) << '\n';
        }
        s << m_ident << visitExpr(*expr.expr) << ')';

        m_ident.erase(0, 4);

        return s.str();
    }